

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uLong crc32_z(unsigned_long crc,uchar *buf,z_size_t len)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  z_crc_t zVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  z_word_t word4_1;
  z_word_t crc4_1;
  z_word_t word3_1;
  z_word_t crc3_1;
  z_word_t word2_1;
  z_word_t crc2_1;
  z_word_t word1_1;
  z_word_t crc1_1;
  z_word_t comb;
  z_word_t word0_1;
  z_word_t crc0_1;
  z_word_t word4;
  z_crc_t crc4;
  z_word_t word3;
  z_crc_t crc3;
  z_word_t word2;
  z_crc_t crc2;
  z_word_t word1;
  z_crc_t crc1;
  z_word_t word0;
  int local_40;
  z_crc_t crc0;
  int k;
  uint endian;
  z_word_t *words;
  z_size_t blks;
  z_size_t len_local;
  uchar *buf_local;
  unsigned_long crc_local;
  
  if (buf == (uchar *)0x0) {
    crc_local = 0;
  }
  else {
    buf_local = (uchar *)((crc ^ 0xffffffffffffffff) & 0xffffffff);
    blks = len;
    len_local = (z_size_t)buf;
    if (0x2e < len) {
      for (; blks != 0 && (len_local & 7) != 0; blks = blks - 1) {
        buf_local = (uchar *)((ulong)buf_local >> 8 ^
                             (ulong)crc_table[((ulong)buf_local ^ (ulong)*(byte *)len_local) & 0xff]
                             );
        len_local = len_local + 1;
      }
      words = (z_word_t *)(blks / 0x28);
      blks = blks % 0x28;
      _k = (ulong *)len_local;
      word0._4_4_ = (z_crc_t)buf_local;
      word1._4_4_ = 0;
      word2._4_4_ = 0;
      word3._4_4_ = 0;
      word4._4_4_ = 0;
      while (words = (z_word_t *)((long)words + -1), words != (z_word_t *)0x0) {
        uVar6 = (ulong)word0._4_4_;
        uVar11 = *_k;
        uVar7 = (ulong)word1._4_4_;
        puVar1 = _k + 1;
        uVar8 = (ulong)word2._4_4_;
        puVar2 = _k + 2;
        uVar9 = (ulong)word3._4_4_;
        puVar3 = _k + 3;
        uVar10 = (ulong)word4._4_4_;
        puVar4 = _k + 4;
        _k = _k + 5;
        word0._4_4_ = crc_braid_table[0][(uVar6 ^ uVar11) & 0xff];
        word1._4_4_ = crc_braid_table[0][(uVar7 ^ *puVar1) & 0xff];
        word2._4_4_ = crc_braid_table[0][(uVar8 ^ *puVar2) & 0xff];
        word3._4_4_ = crc_braid_table[0][(uVar9 ^ *puVar3) & 0xff];
        word4._4_4_ = crc_braid_table[0][(uVar10 ^ *puVar4) & 0xff];
        for (local_40 = 1; local_40 < 8; local_40 = local_40 + 1) {
          word0._4_4_ = crc_braid_table[local_40]
                        [(uVar6 ^ uVar11) >> ((byte)(local_40 << 3) & 0x3f) & 0xff] ^ word0._4_4_;
          word1._4_4_ = crc_braid_table[local_40]
                        [(uVar7 ^ *puVar1) >> ((byte)(local_40 << 3) & 0x3f) & 0xff] ^ word1._4_4_;
          word2._4_4_ = crc_braid_table[local_40]
                        [(uVar8 ^ *puVar2) >> ((byte)(local_40 << 3) & 0x3f) & 0xff] ^ word2._4_4_;
          word3._4_4_ = crc_braid_table[local_40]
                        [(uVar9 ^ *puVar3) >> ((byte)(local_40 << 3) & 0x3f) & 0xff] ^ word3._4_4_;
          word4._4_4_ = crc_braid_table[local_40]
                        [(uVar10 ^ *puVar4) >> ((byte)(local_40 << 3) & 0x3f) & 0xff] ^ word4._4_4_;
        }
      }
      zVar5 = crc_word((ulong)word0._4_4_ ^ *_k);
      zVar5 = crc_word((ulong)word1._4_4_ ^ _k[1] ^ (ulong)zVar5);
      zVar5 = crc_word((ulong)word2._4_4_ ^ _k[2] ^ (ulong)zVar5);
      zVar5 = crc_word((ulong)word3._4_4_ ^ _k[3] ^ (ulong)zVar5);
      zVar5 = crc_word((ulong)word4._4_4_ ^ _k[4] ^ (ulong)zVar5);
      buf_local = (uchar *)(ulong)zVar5;
      _k = _k + 5;
      len_local = (z_size_t)_k;
    }
    for (; 7 < blks; blks = blks - 8) {
      uVar11 = (ulong)buf_local >> 8 ^
               (ulong)crc_table[((ulong)buf_local ^ (ulong)*(byte *)len_local) & 0xff];
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 1)) & 0xff];
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 2)) & 0xff];
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 3)) & 0xff];
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 4)) & 0xff];
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 5)) & 0xff];
      pbVar12 = (byte *)(len_local + 7);
      uVar11 = uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *(byte *)(len_local + 6)) & 0xff];
      len_local = len_local + 8;
      buf_local = (uchar *)(uVar11 >> 8 ^ (ulong)crc_table[(uVar11 ^ *pbVar12) & 0xff]);
    }
    for (; blks != 0; blks = blks - 1) {
      buf_local = (uchar *)((ulong)buf_local >> 8 ^
                           (ulong)crc_table[((ulong)buf_local ^ (ulong)*(byte *)len_local) & 0xff]);
      len_local = len_local + 1;
    }
    crc_local = (ulong)buf_local ^ 0xffffffff;
  }
  return crc_local;
}

Assistant:

unsigned long ZEXPORT crc32_z(unsigned long crc, const unsigned char FAR *buf,
                              z_size_t len) {
    /*
     * zlib convention is to call crc32(0, NULL, 0); before making
     * calls to crc32(). So this is a good, early (and infrequent)
     * place to cache CPU features if needed for those later, more
     * interesting crc32() calls.
     */
#if defined(CRC32_SIMD_SSE42_PCLMUL) || defined(CRC32_ARMV8_CRC32) \
    || defined(RISCV_RVV)
    /*
     * Since this routine can be freely used, check CPU features here.
     */
    if (buf == Z_NULL) {
        if (!len) /* Assume user is calling crc32(0, NULL, 0); */
            cpu_check_features();
        return 0UL;
    }

#endif
#if defined(CRC32_SIMD_AVX512_PCLMUL)
    if (x86_cpu_enable_avx512 && len >= Z_CRC32_AVX512_MINIMUM_LENGTH) {
        /* crc32 64-byte chunks */
        z_size_t chunk_size = len & ~Z_CRC32_AVX512_CHUNKSIZE_MASK;
        crc = ~crc32_avx512_simd_(buf, chunk_size, ~(uint32_t)crc);
        /* check remaining data */
        len -= chunk_size;
        if (!len)
            return crc;
        /* Fall into the default crc32 for the remaining data. */
        buf += chunk_size;
    }
#elif defined(CRC32_SIMD_SSE42_PCLMUL)
    if (x86_cpu_enable_simd && len >= Z_CRC32_SSE42_MINIMUM_LENGTH) {
        /* crc32 16-byte chunks */
        z_size_t chunk_size = len & ~Z_CRC32_SSE42_CHUNKSIZE_MASK;
        crc = ~crc32_sse42_simd_(buf, chunk_size, ~(uint32_t)crc);
        /* check remaining data */
        len -= chunk_size;
        if (!len)
            return crc;
        /* Fall into the default crc32 for the remaining data. */
        buf += chunk_size;
    }
#elif defined(CRC32_ARMV8_CRC32)
    if (arm_cpu_enable_crc32) {
#if defined(__aarch64__)
        /* PMULL is 64bit only, plus code needs at least a 64 bytes buffer. */
        if (arm_cpu_enable_pmull && (len > Z_CRC32_PMULL_MINIMUM_LENGTH)) {
            const size_t chunk_size = len & ~Z_CRC32_PMULL_CHUNKSIZE_MASK;
            crc = ~armv8_crc32_pmull_little(buf, chunk_size, ~(uint32_t)crc);
            /* Check remaining data. */
            len -= chunk_size;
            if (!len)
                return crc;

            /* Fall through for the remaining data. */
            buf += chunk_size;
        }
#endif
        return armv8_crc32_little(buf, len, crc); /* Armv8@32bit or tail. */
    }
#else
    if (buf == Z_NULL) {
        return 0UL;
    }
#endif /* CRC32_SIMD */

#ifdef DYNAMIC_CRC_TABLE
    once(&made, make_crc_table);
#endif /* DYNAMIC_CRC_TABLE */
    /* Pre-condition the CRC */
    crc = (~crc) & 0xffffffff;

#ifdef W

    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        z_size_t blks;
        z_word_t const *words;
        unsigned endian;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((z_size_t)buf & (W - 1)) != 0) {
            len--;
            crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        /* Do endian check at execution time instead of compile time, since ARM
           processors can change the endianness at execution time. If the
           compiler knows what the endianness will be, it can optimize out the
           check and the unused branch. */
        endian = 1;
        if (*(unsigned char *)&endian) {
            /* Little endian. */

            z_crc_t crc0;
            z_word_t word0;
#if N > 1
            z_crc_t crc1;
            z_word_t word1;
#if N > 2
            z_crc_t crc2;
            z_word_t word2;
#if N > 3
            z_crc_t crc3;
            z_word_t word3;
#if N > 4
            z_crc_t crc4;
            z_word_t word4;
#if N > 5
            z_crc_t crc5;
            z_word_t word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = crc;
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            crc = crc_word(crc0 ^ words[0]);
#if N > 1
            crc = crc_word(crc1 ^ words[1] ^ crc);
#if N > 2
            crc = crc_word(crc2 ^ words[2] ^ crc);
#if N > 3
            crc = crc_word(crc3 ^ words[3] ^ crc);
#if N > 4
            crc = crc_word(crc4 ^ words[4] ^ crc);
#if N > 5
            crc = crc_word(crc5 ^ words[5] ^ crc);
#endif
#endif
#endif
#endif
#endif
            words += N;
        }
        else {
            /* Big endian. */

            z_word_t crc0, word0, comb;
#if N > 1
            z_word_t crc1, word1;
#if N > 2
            z_word_t crc2, word2;
#if N > 3
            z_word_t crc3, word3;
#if N > 4
            z_word_t crc4, word4;
#if N > 5
            z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = byte_swap(crc);
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_big_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_big_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_big_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_big_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_big_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_big_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_big_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_big_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_big_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_big_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_big_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_big_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            comb = crc_word_big(crc0 ^ words[0]);
#if N > 1
            comb = crc_word_big(crc1 ^ words[1] ^ comb);
#if N > 2
            comb = crc_word_big(crc2 ^ words[2] ^ comb);
#if N > 3
            comb = crc_word_big(crc3 ^ words[3] ^ comb);
#if N > 4
            comb = crc_word_big(crc4 ^ words[4] ^ comb);
#if N > 5
            comb = crc_word_big(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
            words += N;
            crc = byte_swap(comb);
        }

        /*
          Update the pointer to the remaining bytes to process.
         */
        buf = (unsigned char const *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }
    while (len) {
        len--;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }

    /* Return the CRC, post-conditioned. */
    return crc ^ 0xffffffff;
}